

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testRgbaThreading.cpp
# Opt level: O0

void testRgbaThreading(string *tempDir)

{
  uint uVar1;
  byte bVar2;
  int iVar3;
  ostream *poVar4;
  void *this;
  ostream *this_00;
  char *__rhs;
  uint uVar5;
  exception *e;
  LineOrder in_stack_000000c8;
  RgbaChannels in_stack_000000cc;
  Array2D<Imf_3_2::Rgba> *in_stack_000000d0;
  int in_stack_000000d8;
  int in_stack_000000dc;
  char *in_stack_000000e0;
  Compression in_stack_000000f0;
  int lorder;
  int comp;
  int numThreads_1;
  int n;
  Array2D<Imf_3_2::Rgba> p1;
  int H;
  int W;
  int numThreads;
  int i;
  Array2D<Imf_3_2::Rgba> *in_stack_fffffffffffffeb0;
  int in_stack_fffffffffffffeb8;
  int in_stack_fffffffffffffebc;
  Array2D<Imf_3_2::Rgba> *in_stack_fffffffffffffec0;
  undefined4 in_stack_fffffffffffffed8;
  ostream *in_stack_fffffffffffffef8;
  undefined4 in_stack_ffffffffffffff00;
  float in_stack_ffffffffffffff04;
  string local_d0 [32];
  string local_b0 [32];
  string local_90 [32];
  string local_70 [32];
  int local_50;
  int local_4c;
  int local_48;
  int local_44;
  undefined4 local_24;
  undefined4 local_20;
  int local_1c;
  int local_18;
  
  poVar4 = std::operator<<((ostream *)&std::cout,"Testing setGlobalThreadCount()");
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  bVar2 = IlmThread_3_2::supportsThreads();
  if ((bVar2 & 1) == 0) {
    poVar4 = std::operator<<((ostream *)&std::cout,"   Threading not supported!");
    this = (void *)std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
  }
  else {
    for (local_18 = 0; local_18 < 10000; local_18 = local_18 + 1) {
      in_stack_ffffffffffffff04 = (float)Imath_3_2::Rand32::nextf();
      local_1c = (int)(in_stack_ffffffffffffff04 * 32.0 + 0.5);
      Imf_3_2::setGlobalThreadCount(local_1c);
      if (local_18 % 2000 == 0) {
        in_stack_fffffffffffffef8 = std::operator<<((ostream *)&std::cout,".");
        std::ostream::operator<<(in_stack_fffffffffffffef8,std::flush<char,std::char_traits<char>>);
      }
    }
    poVar4 = std::operator<<((ostream *)&std::cout,"\nok\n");
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    this_00 = std::operator<<((ostream *)&std::cout,
                              "Testing multi-threaded writing of scanlines\nin random-sized blocks")
    ;
    std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
    local_20 = 0xed;
    local_24 = 0x77;
    Imf_3_2::Array2D<Imf_3_2::Rgba>::Array2D
              ((Array2D<Imf_3_2::Rgba> *)
               CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),
               (long)in_stack_fffffffffffffef8,(long)poVar4);
    anon_unknown.dwarf_1f926d::fillPixels
              (in_stack_fffffffffffffec0,in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8);
    for (local_44 = 0; local_44 < 9; local_44 = local_44 + 1) {
      uVar1 = local_44 * 3;
      uVar5 = uVar1;
      if ((int)uVar1 < 0) {
        uVar5 = local_44 * 3 + 7;
      }
      local_48 = uVar1 - (uVar5 & 0xfffffff8);
      Imf_3_2::setGlobalThreadCount(local_48);
      poVar4 = std::operator<<((ostream *)&std::cout,"number of threads: ");
      iVar3 = Imf_3_2::globalThreadCount();
      __rhs = (char *)std::ostream::operator<<(poVar4,iVar3);
      std::ostream::operator<<(__rhs,std::endl<char,std::char_traits<char>>);
      for (local_4c = 0; local_4c < 10; local_4c = local_4c + 1) {
        for (local_50 = 0; local_50 < 2; local_50 = local_50 + 1) {
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         CONCAT44(iVar3,in_stack_fffffffffffffed8),__rhs);
          std::__cxx11::string::c_str();
          anon_unknown.dwarf_1f926d::writeReadRGBA
                    (in_stack_000000e0,in_stack_000000dc,in_stack_000000d8,in_stack_000000d0,
                     in_stack_000000cc,in_stack_000000c8,in_stack_000000f0);
          std::__cxx11::string::~string(local_70);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         CONCAT44(iVar3,in_stack_fffffffffffffed8),__rhs);
          std::__cxx11::string::c_str();
          anon_unknown.dwarf_1f926d::writeReadRGBA
                    (in_stack_000000e0,in_stack_000000dc,in_stack_000000d8,in_stack_000000d0,
                     in_stack_000000cc,in_stack_000000c8,in_stack_000000f0);
          std::__cxx11::string::~string(local_90);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         CONCAT44(iVar3,in_stack_fffffffffffffed8),__rhs);
          std::__cxx11::string::c_str();
          anon_unknown.dwarf_1f926d::writeReadRGBA
                    (in_stack_000000e0,in_stack_000000dc,in_stack_000000d8,in_stack_000000d0,
                     in_stack_000000cc,in_stack_000000c8,in_stack_000000f0);
          std::__cxx11::string::~string(local_b0);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         CONCAT44(iVar3,in_stack_fffffffffffffed8),__rhs);
          std::__cxx11::string::c_str();
          anon_unknown.dwarf_1f926d::writeReadRGBA
                    (in_stack_000000e0,in_stack_000000dc,in_stack_000000d8,in_stack_000000d0,
                     in_stack_000000cc,in_stack_000000c8,in_stack_000000f0);
          std::__cxx11::string::~string(local_d0);
        }
      }
    }
    poVar4 = std::operator<<((ostream *)&std::cout,"ok\n");
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    Imf_3_2::Array2D<Imf_3_2::Rgba>::~Array2D(in_stack_fffffffffffffeb0);
  }
  return;
}

Assistant:

void
testRgbaThreading (const std::string& tempDir)
{
    try
    {
        cout << "Testing setGlobalThreadCount()" << endl;

        if (!ILMTHREAD_NAMESPACE::supportsThreads ())
        {
            cout << "   Threading not supported!" << endl << endl;
            return;
        }

        for (int i = 0; i < 10000; i++)
        {
            int numThreads = int (rand1.nextf () * 32 + 0.5f);
            setGlobalThreadCount (numThreads);

            if (i % 2000 == 0) cout << "." << flush;
        }

        cout << "\nok\n" << endl;

        cout << "Testing multi-threaded writing of scanlines\n"
                "in random-sized blocks"
             << endl;

        const int W = 237;
        const int H = 119;

        Array2D<Rgba> p1 (H, W);
        fillPixels (p1, W, H);

        for (int n = 0; n <= 8; n++)
        {
            int numThreads = (n * 3) % 8;

            setGlobalThreadCount (numThreads);
            cout << "number of threads: " << globalThreadCount () << endl;

            for (int comp = 0; comp < NUM_COMPRESSION_METHODS; ++comp)
            {
                for (int lorder = 0; lorder < RANDOM_Y; ++lorder)
                {
                    writeReadRGBA (
                        (tempDir + "imf_test_rgba.exr").c_str (),
                        W,
                        H,
                        p1,
                        WRITE_RGBA,
                        LineOrder (lorder),
                        Compression (comp));

                    writeReadRGBA (
                        (tempDir + "imf_test_rgba.exr").c_str (),
                        W,
                        H,
                        p1,
                        WRITE_RGB,
                        LineOrder (lorder),
                        Compression (comp));

                    writeReadRGBA (
                        (tempDir + "imf_test_rgba.exr").c_str (),
                        W,
                        H,
                        p1,
                        WRITE_A,
                        LineOrder (lorder),
                        Compression (comp));

                    writeReadRGBA (
                        (tempDir + "imf_test_rgba.exr").c_str (),
                        W,
                        H,
                        p1,
                        RgbaChannels (WRITE_R | WRITE_B),
                        LineOrder (lorder),
                        Compression (comp));
                }
            }
        }

        cout << "ok\n" << endl;
    }
    catch (const std::exception& e)
    {
        cerr << "ERROR -- caught exception: " << e.what () << endl;
        assert (false);
    }
}